

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaUtilityTargetGenerator::Generate(cmNinjaUtilityTargetGenerator *this)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGeneratorTarget *this_01;
  pointer pcVar3;
  undefined8 *puVar4;
  cmCustomCommand *pcVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  cmMakefile *this_02;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar8;
  bool bVar9;
  TargetType TVar10;
  string *psVar11;
  long *plVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  MapToNinjaPathImpl MVar14;
  long lVar15;
  cmCustomCommand *pcVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar17;
  char *__s;
  cmGeneratedFileStream *pcVar18;
  size_type *psVar19;
  string *util_output;
  pointer *ppcVar20;
  bool uses_terminal;
  cmLocalNinjaGenerator *pcVar22;
  array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL> cmdLists;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  string local_370;
  cmGeneratorTarget *local_350;
  cmLocalNinjaGenerator *local_348;
  cmGlobalNinjaGenerator *local_340;
  string local_338;
  cmNinjaDeps deps;
  string utilCommandName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmCustomCommandGenerator ccg;
  cmNinjaDeps util_outputs;
  string local_1f8;
  string local_1d8;
  char *local_1b8;
  size_type local_1b0;
  char local_1a8 [8];
  undefined8 uStack_1a0;
  string local_198;
  string local_178;
  cmNinjaDeps local_158;
  cmNinjaBuild phonyBuild;
  bool bVar21;
  
  local_340 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar22 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar22);
  utilCommandName._M_dataplus._M_p = (pointer)&utilCommandName.field_2;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&utilCommandName,pcVar3,pcVar3 + psVar11->_M_string_length);
  std::__cxx11::string::append((char *)&utilCommandName);
  std::__cxx11::string::append((char *)&utilCommandName);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
  local_348 = pcVar22;
  plVar12 = (long *)std::__cxx11::string::append((char *)&ccg);
  paVar1 = &phonyBuild.Comment.field_2;
  psVar19 = (size_type *)(plVar12 + 2);
  if ((size_type *)*plVar12 == psVar19) {
    phonyBuild.Comment.field_2._M_allocated_capacity = *psVar19;
    phonyBuild.Comment.field_2._8_8_ = plVar12[3];
    phonyBuild.Comment._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    phonyBuild.Comment.field_2._M_allocated_capacity = *psVar19;
    phonyBuild.Comment._M_dataplus._M_p = (pointer)*plVar12;
  }
  phonyBuild.Comment._M_string_length = plVar12[1];
  *plVar12 = (long)psVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&utilCommandName,(ulong)phonyBuild.Comment._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)phonyBuild.Comment._M_dataplus._M_p != paVar1) {
    operator_delete(phonyBuild.Comment._M_dataplus._M_p,
                    phonyBuild.Comment.field_2._M_allocated_capacity + 1);
  }
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&phonyBuild.Comment,&this->super_cmNinjaTargetGenerator,&utilCommandName);
  std::__cxx11::string::operator=((string *)&utilCommandName,(string *)&phonyBuild);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)phonyBuild.Comment._M_dataplus._M_p != paVar1) {
    operator_delete(phonyBuild.Comment._M_dataplus._M_p,
                    phonyBuild.Comment.field_2._M_allocated_capacity + 1);
  }
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"phony","");
  phonyBuild.Rule._M_dataplus._M_p = (pointer)&phonyBuild.Rule.field_2;
  phonyBuild.Comment._M_string_length = 0;
  phonyBuild.Comment.field_2._M_allocated_capacity =
       phonyBuild.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_1b8 == local_1a8) {
    phonyBuild.Rule.field_2._8_8_ = uStack_1a0;
  }
  else {
    phonyBuild.Rule._M_dataplus._M_p = local_1b8;
  }
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header;
  phonyBuild.Rule._M_string_length = local_1b0;
  local_1b0 = 0;
  local_1a8[0] = '\0';
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  phonyBuild.Outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  phonyBuild.Outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  phonyBuild.Outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phonyBuild.ImplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  phonyBuild.ImplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  phonyBuild.ImplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phonyBuild.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  phonyBuild.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  phonyBuild.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phonyBuild.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  phonyBuild.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  phonyBuild.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phonyBuild.OrderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  phonyBuild.OrderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  phonyBuild.OrderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  phonyBuild.RspFile._M_dataplus._M_p = (pointer)&phonyBuild.RspFile.field_2;
  phonyBuild.RspFile._M_string_length = 0;
  phonyBuild.RspFile.field_2._M_local_buf[0] = '\0';
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8 = local_1a8;
  phonyBuild.Comment._M_dataplus._M_p = (pointer)paVar1;
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&util_outputs,1,&utilCommandName,(allocator_type *)&ccg);
  cmdLists._M_elems[0] = cmGeneratorTarget::GetPreBuildCommands(this_01);
  cmdLists._M_elems[1] = cmGeneratorTarget::GetPostBuildCommands(this_01);
  local_350 = this_01;
  bVar21 = false;
  uses_terminal = false;
  lVar15 = 0;
  do {
    puVar4 = *(undefined8 **)((long)cmdLists._M_elems + lVar15);
    pcVar5 = (cmCustomCommand *)puVar4[1];
    for (pcVar16 = (cmCustomCommand *)*puVar4; pcVar16 != pcVar5; pcVar16 = pcVar16 + 1) {
      psVar11 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      pcVar3 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + psVar11->_M_string_length);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&ccg,pcVar16,&local_1d8,(cmLocalGenerator *)local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._0_8_ + 1);
      }
      pcVar22 = local_348;
      cmLocalNinjaGenerator::AppendCustomCommandDeps(local_348,&ccg,&deps);
      cmLocalNinjaGenerator::AppendCustomCommandLines(pcVar22,&ccg,&commands);
      pvVar13 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
      _Var6._M_current =
           (pvVar13->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var7._M_current =
           (pvVar13->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar14.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var6,_Var7,&util_outputs,MVar14);
      bVar9 = cmCustomCommand::GetUsesTerminal(pcVar16);
      uses_terminal = bVar21;
      if (bVar9) {
        uses_terminal = true;
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
      bVar21 = uses_terminal;
    }
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x10);
  this_02 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"CMAKE_BUILD_TYPE","");
  psVar11 = cmMakefile::GetSafeDefinition(this_02,(string *)&ccg);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  cmdLists._M_elems[1] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  local_388._M_allocated_capacity = 0;
  cmGeneratorTarget::GetSourceFiles
            (local_350,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cmdLists,psVar11)
  ;
  pvVar8 = cmdLists._M_elems[1];
  if (cmdLists._M_elems[0] != cmdLists._M_elems[1]) {
    ppcVar20 = (pointer *)cmdLists._M_elems[0];
    do {
      pcVar16 = cmSourceFile::GetCustomCommand((cmSourceFile *)*ppcVar20);
      if (pcVar16 != (cmCustomCommand *)0x0) {
        psVar11 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this)
        ;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        pcVar3 = (psVar11->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar3,pcVar3 + psVar11->_M_string_length);
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  (&ccg,pcVar16,&local_1f8,(cmLocalGenerator *)local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._0_8_ + 1);
        }
        cmLocalNinjaGenerator::AddCustomCommandTarget(local_348,pcVar16,local_350);
        pvVar13 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&ccg);
        pvVar17 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
        _Var6._M_current =
             (pvVar13->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var7._M_current =
             (pvVar13->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar14.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var6,_Var7,&deps,MVar14);
        _Var6._M_current =
             (pvVar17->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var7._M_current =
             (pvVar17->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar14.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var6,_Var7,&deps,MVar14);
        cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
      }
      ppcVar20 = ppcVar20 + 1;
    } while ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)ppcVar20 != pvVar8);
  }
  if (cmdLists._M_elems[0] != (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0) {
    operator_delete(cmdLists._M_elems[0],
                    local_388._M_allocated_capacity - (long)cmdLists._M_elems[0]);
  }
  pcVar22 = local_348;
  cmLocalNinjaGenerator::AppendTargetOutputs(local_348,local_350,&phonyBuild.Outputs);
  cmLocalNinjaGenerator::AppendTargetDepends(pcVar22,local_350,&deps,DependOnTargetArtifact);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&cmdLists,&this->super_cmNinjaTargetGenerator);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&cmdLists,0,(char *)0x0,0x4fc8f2);
    psVar19 = &ccg.Config._M_string_length;
    pcVar16 = (cmCustomCommand *)(plVar12 + 2);
    if ((cmCustomCommand *)*plVar12 == pcVar16) {
      ccg.Config._M_string_length =
           (size_type)
           (pcVar16->Outputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ccg.Config.field_2._M_allocated_capacity = plVar12[3];
      ccg.CC = (cmCustomCommand *)psVar19;
    }
    else {
      ccg.Config._M_string_length =
           (size_type)
           (pcVar16->Outputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ccg.CC = (cmCustomCommand *)*plVar12;
    }
    ccg.Config._M_dataplus._M_p = (pointer)plVar12[1];
    *plVar12 = (long)pcVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&phonyBuild,(string *)&ccg);
    if (ccg.CC != (cmCustomCommand *)psVar19) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLists._M_elems[0] != &local_388) {
      operator_delete(cmdLists._M_elems[0],local_388._M_allocated_capacity + 1);
    }
    ccg.Config._M_string_length =
         (size_type)
         phonyBuild.ExplicitDeps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ccg.Config._M_dataplus._M_p =
         (pointer)phonyBuild.ExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    ccg.CC = (cmCustomCommand *)
             phonyBuild.ExplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    phonyBuild.ExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    phonyBuild.ExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    phonyBuild.ExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ccg);
    pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::WriteBuild(local_340,(ostream *)pcVar18,&phonyBuild,0,(bool *)0x0);
LAB_0022f98b:
    TVar10 = cmGeneratorTarget::GetType(local_350);
    if (TVar10 == GLOBAL_TARGET) goto LAB_0022f9e8;
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias(local_340,(string *)&ccg,local_350);
  }
  else {
    cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmdLists,"utility","");
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)&ccg,pcVar22,&commands,(string *)&cmdLists,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLists._M_elems[0] != &local_388) {
      operator_delete(cmdLists._M_elems[0],local_388._M_allocated_capacity + 1);
    }
    cmdLists._M_elems[1] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
    local_388._M_allocated_capacity = local_388._M_allocated_capacity & 0xffffffffffffff00;
    paVar1 = &local_370.field_2;
    cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&local_388;
    local_370._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"EchoString","");
    __s = cmGeneratorTarget::GetProperty(local_350,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != paVar1) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    pvVar8 = cmdLists._M_elems[1];
    if (__s == (char *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_338,&this->super_cmNinjaTargetGenerator);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x4fc91a);
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_370.field_2._M_allocated_capacity = *psVar19;
        local_370.field_2._8_8_ = plVar12[3];
        local_370._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar19;
        local_370._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_370._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&cmdLists,(string *)&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != paVar1) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      strlen(__s);
      pcVar22 = local_348;
      std::__cxx11::string::_M_replace((ulong)&cmdLists,0,(char *)pvVar8,(ulong)__s);
    }
    local_370._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"$(CMAKE_SOURCE_DIR)","");
    psVar11 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar22);
    this_00 = &(pcVar22->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    cmOutputConverter::ConvertToOutputFormat(&local_338,this_00,psVar11,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&ccg,&local_370,&local_338);
    paVar2 = &local_338.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != paVar1) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    local_370._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"$(CMAKE_BINARY_DIR)","");
    psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_348);
    cmOutputConverter::ConvertToOutputFormat(&local_338,this_00,psVar11,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&ccg,&local_370,&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != paVar1) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ReplaceString((string *)&ccg,"$(ARGS)","");
    lVar15 = std::__cxx11::string::find((char)&ccg,0x24);
    if (lVar15 == -1) {
      for (; util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          util_outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               util_outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        cmGlobalNinjaGenerator::SeenCustomCommandOutput
                  (local_340,
                   util_outputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_338,&this->super_cmNinjaTargetGenerator);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x4fc8f2);
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_370.field_2._M_allocated_capacity = *psVar19;
        local_370.field_2._8_8_ = plVar12[3];
        local_370._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar19;
        local_370._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_370._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGlobalNinjaGenerator::WriteCustomCommandBuild
                (local_340,(string *)&ccg,(string *)&cmdLists,&local_370,&local_178,&local_198,
                 uses_terminal,true,&util_outputs,&deps,&local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != paVar1) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&phonyBuild.ExplicitDeps,&utilCommandName);
      pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild(local_340,(ostream *)pcVar18,&phonyBuild,0,(bool *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdLists._M_elems[0] != &local_388) {
        operator_delete(cmdLists._M_elems[0],local_388._M_allocated_capacity + 1);
      }
      if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
        operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
      }
      goto LAB_0022f98b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLists._M_elems[0] != &local_388) {
      operator_delete(cmdLists._M_elems[0],local_388._M_allocated_capacity + 1);
    }
  }
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
LAB_0022f9e8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  cmNinjaBuild::~cmNinjaBuild(&phonyBuild);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)utilCommandName._M_dataplus._M_p != &utilCommandName.field_2) {
    operator_delete(utilCommandName._M_dataplus._M_p,
                    utilCommandName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::Generate()
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
  cmLocalNinjaGenerator* lg = this->GetLocalGenerator();
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  std::string utilCommandName = lg->GetCurrentBinaryDirectory();
  utilCommandName += "/CMakeFiles";
  utilCommandName += "/";
  utilCommandName += this->GetTargetName() + ".util";
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  cmNinjaBuild phonyBuild("phony");
  std::vector<std::string> commands;
  cmNinjaDeps deps, util_outputs(1, utilCommandName);

  bool uses_terminal = false;
  {
    std::array<std::vector<cmCustomCommand> const*, 2> const cmdLists = {
      { &genTarget->GetPreBuildCommands(), &genTarget->GetPostBuildCommands() }
    };

    for (std::vector<cmCustomCommand> const* cmdList : cmdLists) {
      for (cmCustomCommand const& ci : *cmdList) {
        cmCustomCommandGenerator ccg(ci, this->GetConfigName(), lg);
        lg->AppendCustomCommandDeps(ccg, deps);
        lg->AppendCustomCommandLines(ccg, commands);
        std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
        std::transform(ccByproducts.begin(), ccByproducts.end(),
                       std::back_inserter(util_outputs), MapToNinjaPath());
        if (ci.GetUsesTerminal()) {
          uses_terminal = true;
        }
      }
    }
  }

  {
    std::string const& config =
      this->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::vector<cmSourceFile*> sources;
    genTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* source : sources) {
      if (cmCustomCommand const* cc = source->GetCustomCommand()) {
        cmCustomCommandGenerator ccg(*cc, this->GetConfigName(), lg);
        lg->AddCustomCommandTarget(cc, genTarget);

        // Depend on all custom command outputs.
        const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
        const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
        std::transform(ccOutputs.begin(), ccOutputs.end(),
                       std::back_inserter(deps), MapToNinjaPath());
        std::transform(ccByproducts.begin(), ccByproducts.end(),
                       std::back_inserter(deps), MapToNinjaPath());
      }
    }
  }

  lg->AppendTargetOutputs(genTarget, phonyBuild.Outputs);
  lg->AppendTargetDepends(genTarget, deps);

  if (commands.empty()) {
    phonyBuild.Comment = "Utility command for " + this->GetTargetName();
    phonyBuild.ExplicitDeps = std::move(deps);
    gg->WriteBuild(this->GetBuildFileStream(), phonyBuild);
  } else {
    std::string command =
      lg->BuildCommandLine(commands, "utility", this->GeneratorTarget);
    std::string desc;
    const char* echoStr = genTarget->GetProperty("EchoString");
    if (echoStr) {
      desc = echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");

    if (command.find('$') != std::string::npos) {
      return;
    }

    for (std::string const& util_output : util_outputs) {
      gg->SeenCustomCommandOutput(util_output);
    }

    gg->WriteCustomCommandBuild(command, desc,
                                "Utility command for " + this->GetTargetName(),
                                /*depfile*/ "", /*job_pool*/ "", uses_terminal,
                                /*restat*/ true, util_outputs, deps);

    phonyBuild.ExplicitDeps.push_back(utilCommandName);
    gg->WriteBuild(this->GetBuildFileStream(), phonyBuild);
  }

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
    gg->AddTargetAlias(this->GetTargetName(), genTarget);
  }
}